

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerHLSL::bitcast_glsl_op_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRType *out_type,SPIRType *in_type)

{
  BaseType BVar1;
  BaseType BVar2;
  CompilerError *this_00;
  char *pcVar3;
  BaseType BVar4;
  BaseType BVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  BaseType local_58;
  BaseType local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  BVar1 = out_type->basetype;
  BVar4 = BVar1 ^ UInt;
  BVar2 = in_type->basetype;
  if (BVar4 != Unknown || (BVar2 ^ Int) != Unknown) {
    if ((BVar1 ^ UInt64) != Unknown || (BVar2 ^ Int64) != Unknown) {
      if (BVar4 == Unknown && (BVar2 ^ Float) == Unknown) {
        pcVar3 = "asuint";
        goto LAB_00165d9d;
      }
      BVar5 = BVar2 ^ UInt;
      if ((BVar1 ^ Int) != Unknown || BVar5 != Unknown) {
        local_54 = BVar1 ^ Int64;
        local_58 = BVar2 ^ UInt64;
        if (local_54 != Unknown || local_58 != Unknown) {
          if ((BVar1 ^ Int) == Unknown && (BVar2 ^ Float) == Unknown) {
            pcVar3 = "asint";
          }
          else {
            if (((BVar1 ^ Float) != Unknown || BVar5 != Unknown) &&
               ((BVar1 ^ Float) != Unknown || (BVar2 ^ Int) != Unknown)) {
              local_54 = local_54 | BVar2 ^ Double;
              if (local_54 == Unknown) {
                this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
                CompilerError::CompilerError(this_00,"Double to Int64 is not supported in HLSL.");
              }
              else {
                if ((BVar1 ^ UInt64) != Unknown || (BVar2 ^ Double) != Unknown) {
                  if (((BVar2 ^ Int64) == Unknown && (BVar1 ^ Double) == Unknown) ||
                     ((BVar1 ^ Double) == Unknown && local_58 == Unknown)) {
                    pcVar3 = "asdouble";
                  }
                  else if (in_type->vecsize == 1 && (BVar5 == Unknown && (BVar1 ^ Half) == Unknown))
                  {
                    if (this->requires_explicit_fp16_packing == false) {
                      this->requires_explicit_fp16_packing = true;
                      Compiler::force_recompile((Compiler *)this);
                    }
                    pcVar3 = "spvUnpackFloat2x16";
                  }
                  else {
                    if (in_type->vecsize != 2 || (BVar4 != Unknown || (BVar2 ^ Half) != Unknown)) {
                      if (BVar1 == UShort && (BVar2 ^ Half) == Unknown) {
                        if ((this->hlsl_options).shader_model < 0x28) {
                          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
                          CompilerError::CompilerError
                                    (this_00,"Half to UShort requires Shader Model 4.");
                          goto LAB_00165fa5;
                        }
                        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                                  (&local_50,this,out_type,0);
                        ::std::operator+(&bStack_78,"(",&local_50);
                        ::std::operator+(__return_storage_ptr__,&bStack_78,")f32tof16");
                      }
                      else {
                        if ((BVar1 ^ Half) != Unknown || BVar2 != UShort) {
                          pcVar3 = "";
                          goto LAB_00165d9d;
                        }
                        if ((this->hlsl_options).shader_model < 0x28) {
                          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
                          CompilerError::CompilerError
                                    (this_00,"UShort to Half requires Shader Model 4.");
                          goto LAB_00165fa5;
                        }
                        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                                  (&local_50,this,out_type,0);
                        ::std::operator+(&bStack_78,"(",&local_50);
                        ::std::operator+(__return_storage_ptr__,&bStack_78,")f16tof32");
                      }
                      ::std::__cxx11::string::~string((string *)&bStack_78);
                      ::std::__cxx11::string::~string((string *)&local_50);
                      return __return_storage_ptr__;
                    }
                    if (this->requires_explicit_fp16_packing == false) {
                      this->requires_explicit_fp16_packing = true;
                      Compiler::force_recompile((Compiler *)this);
                    }
                    pcVar3 = "spvPackFloat2x16";
                  }
                  goto LAB_00165d9d;
                }
                this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
                CompilerError::CompilerError(this_00,"Double to UInt64 is not supported in HLSL.");
              }
LAB_00165fa5:
              __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            pcVar3 = "asfloat";
          }
LAB_00165d9d:
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,pcVar3,(allocator *)&bStack_78);
          return __return_storage_ptr__;
        }
      }
    }
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
            (__return_storage_ptr__,this,out_type,0);
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::bitcast_glsl_op(const SPIRType &out_type, const SPIRType &in_type)
{
	if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Int)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::Int64)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Float)
		return "asuint";
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::UInt)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::UInt64)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::Float)
		return "asint";
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::UInt)
		return "asfloat";
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::Int)
		return "asfloat";
	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::Double)
		SPIRV_CROSS_THROW("Double to Int64 is not supported in HLSL.");
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::Double)
		SPIRV_CROSS_THROW("Double to UInt64 is not supported in HLSL.");
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::Int64)
		return "asdouble";
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::UInt64)
		return "asdouble";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UInt && in_type.vecsize == 1)
	{
		if (!requires_explicit_fp16_packing)
		{
			requires_explicit_fp16_packing = true;
			force_recompile();
		}
		return "spvUnpackFloat2x16";
	}
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Half && in_type.vecsize == 2)
	{
		if (!requires_explicit_fp16_packing)
		{
			requires_explicit_fp16_packing = true;
			force_recompile();
		}
		return "spvPackFloat2x16";
	}
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::Half)
	{
		if (hlsl_options.shader_model < 40)
			SPIRV_CROSS_THROW("Half to UShort requires Shader Model 4.");
		return "(" + type_to_glsl(out_type) + ")f32tof16";
	}
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UShort)
	{
		if (hlsl_options.shader_model < 40)
			SPIRV_CROSS_THROW("UShort to Half requires Shader Model 4.");
		return "(" + type_to_glsl(out_type) + ")f16tof32";
	}
	else
		return "";
}